

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::InfixOperator::applyPoint
          (Interval *__return_storage_ptr__,InfixOperator *this,EvalContext *ctx,double x,double y)

{
  byte bVar1;
  Interval local_40;
  double local_28;
  
  local_28 = y;
  local_40.m_hi = (double)(**(code **)(*(long *)this + 0x68))(this);
  local_40.m_hasNaN = NAN(local_40.m_hi);
  local_40.m_lo = local_40.m_hi;
  if (local_40.m_hasNaN) {
    local_40.m_lo = INFINITY;
    local_40.m_hi = -INFINITY;
  }
  if (x < -1.79769313486232e+308 == x <= 1.79769313486232e+308) {
    bVar1 = 0;
  }
  else {
    bVar1 = -(local_28 < -1.79769313486232e+308) ^ -(local_28 <= 1.79769313486232e+308);
  }
  tcu::FloatFormat::roundOut(__return_storage_ptr__,&ctx->format,&local_40,(bool)(bVar1 & 1));
  return __return_storage_ptr__;
}

Assistant:

Interval		applyPoint		(const EvalContext&	ctx,
									 double				x,
									 double				y) const
	{
		const double exact	= this->applyExact(x, y);

		// Allow either representable number on both sides of the exact value,
		// but require exactly representable values to be preserved.
		return ctx.format.roundOut(exact, !deIsInf(x) && !deIsInf(y));
	}